

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPiPerm(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  
  Gia_ManRandom(1);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar8;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar11 = 0; iVar11 < p->vCis->nSize; iVar11 = iVar11 + 1) {
    pGVar9 = Gia_ManCi(p,iVar11);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar9->Value = uVar2;
  }
  for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
    pGVar9 = Gia_ManObj(p,iVar11);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
      iVar3 = Gia_ObjFanin0Copy(pGVar9);
      iVar4 = Gia_ObjFanin1Copy(pGVar9);
      uVar5 = Gia_ManRandom(0);
      uVar2 = p->vCis->nSize;
      uVar6 = Gia_ManRandom(0);
      uVar1 = p->vCis->nSize;
      iVar7 = Abc_Lit2Var(iVar3);
      if (iVar7 <= p->vCis->nSize) {
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_Var2Lit(uVar5 % uVar2 + 1,iVar3);
      }
      iVar7 = Abc_Lit2Var(iVar4);
      if (iVar7 <= p->vCis->nSize) {
        iVar4 = Abc_LitIsCompl(iVar4);
        iVar4 = Abc_Var2Lit(uVar6 % uVar1 + 1,iVar4);
      }
      uVar2 = Gia_ManHashAnd(p_00,iVar3,iVar4);
      pGVar9->Value = uVar2;
    }
  }
  for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
    pGVar9 = Gia_ManCo(p,iVar11);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar9);
    uVar2 = Gia_ManAppendCo(p_00,iVar3);
    pGVar9->Value = uVar2;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManDupPiPerm( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManRandom(1);
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iLit0 = Gia_ObjFanin0Copy(pObj);
        int iLit1 = Gia_ObjFanin1Copy(pObj);
        int iPlace0 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        int iPlace1 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        if ( Abc_Lit2Var(iLit0) <= Gia_ManCiNum(p) )
            iLit0 = Abc_Var2Lit( iPlace0+1, Abc_LitIsCompl(iLit0) );
        if ( Abc_Lit2Var(iLit1) <= Gia_ManCiNum(p) )
            iLit1 = Abc_Var2Lit( iPlace1+1, Abc_LitIsCompl(iLit1) );
        pObj->Value = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}